

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::emitCursorPositionChanged(QWidgetLineControl *this)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_40;
  int local_3c;
  code *local_38;
  int *local_30;
  int *local_28;
  undefined4 local_20;
  undefined4 local_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(this + 0x40);
  iVar2 = *(int *)(this + 100);
  if (iVar1 != iVar2) {
    *(int *)(this + 100) = iVar1;
    local_30 = &local_3c;
    local_28 = &local_40;
    local_38 = (code *)0x0;
    local_40 = iVar1;
    local_3c = iVar2;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
    if ((*(long *)(this + 0x28) == 0) || (*(int *)(this + 0x114) <= *(int *)(this + 0x110))) {
      local_28 = *(int **)(this + 0x130);
      if (local_28 == (int *)0x0) {
        local_28 = *(int **)(*(long *)(this + 8) + 0x10);
      }
      local_1c = *(undefined4 *)(this + 0x40);
      local_20 = 0xffffffff;
      local_38 = QTextCursor::isNull;
      local_30 = (int *)0xaaaaaaaa0000011b;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
      QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent
                ((QAccessibleTextCursorEvent *)&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::emitCursorPositionChanged()
{
    if (m_cursor != m_lastCursorPos) {
        const int oldLast = m_lastCursorPos;
        m_lastCursorPos = m_cursor;
        emit cursorPositionChanged(oldLast, m_cursor);
#if QT_CONFIG(accessibility)
        // otherwise we send a selection update which includes the cursor
        if (!hasSelectedText()) {
            QAccessibleTextCursorEvent event(accessibleObject(), m_cursor);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}